

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.h
# Opt level: O0

void __thiscall TPZSkylMatrix<float>::ReallocForNuma(TPZSkylMatrix<float> *this)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  long lVar4;
  int64_t iVar5;
  float **ppfVar6;
  long in_RDI;
  int i;
  float *new_start;
  float *old_start;
  TPZVec<float_*> *in_stack_ffffffffffffffd0;
  int local_1c;
  
  TPZVec<float_*>::ReallocForNuma(in_stack_ffffffffffffffd0);
  pfVar2 = TPZVec<float>::operator[]((TPZVec<float> *)(in_RDI + 0x40),0);
  TPZVec<float>::ReallocForNuma((TPZVec<float> *)in_stack_ffffffffffffffd0);
  pfVar3 = TPZVec<float>::operator[]((TPZVec<float> *)(in_RDI + 0x40),0);
  local_1c = 0;
  while( true ) {
    lVar4 = (long)local_1c;
    iVar5 = TPZVec<float_*>::size((TPZVec<float_*> *)(in_RDI + 0x20));
    if (iVar5 <= lVar4) break;
    ppfVar6 = TPZVec<float_*>::operator[]((TPZVec<float_*> *)(in_RDI + 0x20),(long)local_1c);
    pfVar1 = *ppfVar6;
    ppfVar6 = TPZVec<float_*>::operator[]((TPZVec<float_*> *)(in_RDI + 0x20),(long)local_1c);
    *ppfVar6 = pfVar3 + ((long)pfVar1 - (long)pfVar2 >> 2);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void ReallocForNuma() {
        fElem.ReallocForNuma();
        TVar* old_start = &fStorage[0];
        fStorage.ReallocForNuma();
        TVar* new_start = &fStorage[0];
        for (int i=0; i<fElem.size(); i++) {
            fElem[i] = new_start + (fElem[i]-old_start);
        }
	}